

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall
FxCompareEq::EmitCommon(FxCompareEq *this,VMFunctionBuilder *build,bool forcompare,bool invert)

{
  int iVar1;
  FxExpression *pFVar2;
  uint uVar3;
  ExpEmit EVar5;
  ExpEmit EVar6;
  uint uVar4;
  ExpEmit EVar7;
  ExpEmit EVar8;
  uint uVar9;
  uint opcode;
  char cVar10;
  ushort local_50;
  ExpEmit op2;
  ExpEmit op1;
  uint extraout_var;
  uint extraout_var_00;
  
  EVar5._0_4_ = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  EVar5.Konst = (bool)(char)extraout_var;
  EVar5.Fixed = (bool)(char)(extraout_var >> 8);
  EVar5.Final = (bool)(char)(extraout_var >> 0x10);
  EVar5.Target = (bool)(char)(extraout_var >> 0x18);
  pFVar2 = (this->super_FxBinary).right;
  op1 = EVar5;
  EVar6._0_4_ = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
  EVar6.Konst = (bool)(char)extraout_var_00;
  EVar6.Fixed = (bool)(char)(extraout_var_00 >> 8);
  EVar6.Final = (bool)(char)(extraout_var_00 >> 0x10);
  EVar6.Target = (bool)(char)(extraout_var_00 >> 0x18);
  cVar10 = (char)(EVar5._0_4_ >> 0x10);
  op2 = EVar6;
  if (cVar10 != (char)(EVar6._0_4_ >> 0x10)) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xdcd,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
  }
  if (cVar10 == '\x02') {
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    iVar1 = (this->super_FxBinary).Operator;
    if (2 < iVar1 - 0x11fU) {
      __assert_fail("Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdd3,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    uVar4 = 0x20;
    if (iVar1 == 0x120) {
      uVar4 = 1;
    }
    uVar9 = 0;
    if (iVar1 != 0x11f) {
      uVar9 = uVar4;
    }
    uVar4 = uVar9 + 8;
    if ((extraout_var & 1) == 0) {
      uVar4 = uVar9;
    }
    uVar9 = uVar4 + 0x10;
    if ((extraout_var_00 & 1) == 0) {
      uVar9 = uVar4;
    }
    uVar9 = invert ^ uVar9;
    if (forcompare) {
      VMFunctionBuilder::Emit(build,0x59,uVar9,EVar5._0_4_ & 0xffff,EVar6._0_4_ & 0xffff);
    }
    else {
      VMFunctionBuilder::Emit(build,1,uVar3 & 0xffff,0,0);
      VMFunctionBuilder::Emit(build,0x59,uVar9,EVar5._0_4_ & 0xffff,EVar6._0_4_ & 0xffff);
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,uVar3 & 0xffff,1);
    }
    ExpEmit::Free(&op1,build);
    ExpEmit::Free(&op2,build);
  }
  else {
    EVar7 = EVar6;
    EVar8 = EVar6;
    uVar9 = EVar5._0_4_;
    op2 = EVar5;
    uVar4 = extraout_var;
    uVar3 = extraout_var_00;
    if ((extraout_var & 1) == 0) {
      EVar7.Konst = false;
      EVar7.Fixed = false;
      EVar7.Final = false;
      EVar7.Target = false;
      EVar7.RegNum = (short)EVar5._0_4_;
      EVar7.RegType = (char)(EVar5._0_4_ >> 0x10);
      EVar7.RegCount = (char)(EVar5._0_4_ >> 0x18);
      EVar8 = EVar5;
      uVar9 = EVar6._0_4_;
      op2 = EVar6;
      EVar6 = op1;
      uVar4 = extraout_var_00;
      uVar3 = extraout_var;
    }
    op1 = EVar6;
    if ((uVar3 & 1) != 0) {
      __assert_fail("!op1.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdee,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    if (2 < (byte)(EVar8.RegCount - 1)) {
      __assert_fail("op1.RegCount >= 1 && op1.RegCount <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdef,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    if (cVar10 == '\0') {
      opcode = 0x89;
    }
    else if ((EVar5._0_4_ >> 0x10 & 0xff) == 1) {
      opcode = (&UINT_005f3128)[(ulong)EVar8 >> 0x18 & 0xff];
    }
    else {
      opcode = 0xcf;
    }
    ExpEmit::Free(&op1,build);
    if ((uVar4 & 1) == 0) {
      ExpEmit::Free(&op2,build);
    }
    else {
      opcode = opcode + 1;
    }
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,1,uVar3 & 0xffff,0,0);
    }
    iVar1 = (this->super_FxBinary).Operator;
    uVar4 = 0x20;
    if (iVar1 != 0x121) {
      uVar4 = (uint)(iVar1 != 0x11f);
    }
    local_50 = EVar7.RegNum;
    VMFunctionBuilder::Emit(build,opcode,uVar4 ^ invert,(uint)local_50,uVar9 & 0xffff);
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,uVar3 & 0xffff,1);
    }
  }
  EVar8._0_4_ = uVar3 & 0xffff | 0x1000000;
  EVar8.Konst = false;
  EVar8.Fixed = false;
  EVar8.Final = false;
  EVar8.Target = false;
  return EVar8;
}

Assistant:

ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *build, bool forcompare, bool invert)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	int instr;

	if (op1.RegType == REGT_STRING)
	{
		ExpEmit to(build, REGT_INT);
		assert(Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq);
		int a = Operator == TK_Eq ? CMP_EQ :
			Operator == TK_Neq ? CMP_EQ | CMP_CHECK : CMP_EQ | CMP_APPROX;

		if (op1.Konst) a |= CMP_BK;
		if (op2.Konst) a |= CMP_CK;
		if (invert) a ^= CMP_CHECK;

		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(OP_CMPS, a, op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		op1.Free(build);
		op2.Free(build);
		return to;
	}
	else
	{

		// Only the second operand may be constant.
		if (op1.Konst)
		{
			swapvalues(op1, op2);
		}
		assert(!op1.Konst);
		assert(op1.RegCount >= 1 && op1.RegCount <= 3);

		ExpEmit to(build, REGT_INT);

		static int flops[] = { OP_EQF_R, OP_EQV2_R, OP_EQV3_R };
		instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? flops[op1.RegCount - 1] :
			OP_EQA_R;
		op1.Free(build);
		if (!op2.Konst)
		{
			op2.Free(build);
		}
		else
		{
			instr += 1;
		}

		// See FxUnaryNotBoolean for comments, since it's the same thing.
		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(instr, int(invert) ^ (Operator == TK_ApproxEq ? CMP_APPROX : ((Operator != TK_Eq) ? CMP_CHECK : 0)), op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		return to;
	}
}